

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O1

pair<__gnu_cxx::__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>,_bool>
 pdqsort_detail::
 partition_right_branchless<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,std::less<FractionalInteger>>
           (double *begin,FractionalInteger *end)

{
  uchar *offsets_l;
  double dVar1;
  HighsInt HVar2;
  pointer ppVar3;
  pointer ppVar4;
  pointer ppVar5;
  char cVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  HighsInt HVar13;
  double dVar14;
  double dVar15;
  pointer ppVar16;
  pointer ppVar17;
  double dVar18;
  double dVar19;
  pointer ppVar20;
  pointer ppVar21;
  long lVar22;
  FractionalInteger *pFVar23;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  long lVar27;
  undefined8 *puVar28;
  ulong uVar29;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar30;
  FractionalInteger *pFVar31;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *pvVar32;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  first;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *pvVar33;
  ulong uVar34;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  _Var35;
  FractionalInteger *pFVar36;
  FractionalInteger *pFVar37;
  ulong uVar38;
  ulong uVar39;
  pair<__gnu_cxx::__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>,_bool>
  pVar40;
  uchar offsets_l_storage [128];
  uchar offsets_r_storage [128];
  ulong local_1f8;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  local_1e8;
  undefined4 local_19c;
  undefined4 uStack_198;
  undefined4 local_12c;
  undefined4 uStack_128;
  byte bStack_101;
  uchar local_100 [127];
  byte bStack_81;
  uchar local_80 [80];
  
  dVar14 = *begin;
  dVar15 = begin[1];
  dVar1 = begin[2];
  HVar2 = *(HighsInt *)(begin + 3);
  ppVar16 = (pointer)begin[4];
  ppVar17 = (pointer)begin[5];
  ppVar3 = (pointer)begin[6];
  begin[4] = 0.0;
  begin[5] = 0.0;
  begin[6] = 0.0;
  lVar27 = 0x20;
  lVar24 = 0;
  do {
    lVar22 = lVar27 + 0x28;
    lVar24 = lVar24 + -0x38;
    lVar27 = lVar27 + 0x38;
  } while (dVar1 < *(double *)((long)begin + lVar22));
  pFVar37 = (FractionalInteger *)((long)begin - lVar24);
  if (lVar24 == -0x38) {
    do {
      if (end <= pFVar37) break;
      pFVar36 = end + -1;
      end = end + -1;
    } while (pFVar36->score <= dVar1);
  }
  else {
    do {
      pFVar36 = end + -1;
      end = end + -1;
    } while (pFVar36->score <= dVar1);
  }
  pFVar36 = pFVar37;
  if (pFVar37 < end) {
    puVar28 = (undefined8 *)(lVar27 + (long)begin);
    dVar18 = (double)puVar28[-4];
    dVar19 = (double)puVar28[-3];
    uVar30 = *(undefined8 *)((long)puVar28 + -0xc);
    uStack_128 = (undefined4)((ulong)*(undefined8 *)((long)puVar28 + -0x14) >> 0x20);
    local_12c = (undefined4)((ulong)dVar19 >> 0x20);
    ppVar4 = (pointer)puVar28[2];
    ppVar20 = (pointer)*puVar28;
    ppVar21 = (pointer)puVar28[1];
    *puVar28 = 0;
    puVar28[1] = 0;
    puVar28[2] = 0;
    uVar7 = *(undefined4 *)&end->fractionality;
    uVar8 = *(undefined4 *)((long)&end->fractionality + 4);
    uVar9 = *(undefined4 *)&end->row_ep_norm2;
    uVar10 = *(undefined4 *)((long)&end->row_ep_norm2 + 4);
    uVar11 = *(undefined4 *)&end->score;
    uVar12 = *(undefined4 *)((long)&end->score + 4);
    HVar13 = end->basisIndex;
    *(undefined4 *)((long)puVar28 + -0x14) = *(undefined4 *)((long)&end->row_ep_norm2 + 4);
    *(undefined4 *)(puVar28 + -2) = uVar11;
    *(undefined4 *)((long)puVar28 + -0xc) = uVar12;
    *(HighsInt *)(puVar28 + -1) = HVar13;
    *(undefined4 *)(puVar28 + -4) = uVar7;
    *(undefined4 *)((long)puVar28 + -0x1c) = uVar8;
    *(undefined4 *)(puVar28 + -3) = uVar9;
    *(undefined4 *)((long)puVar28 + -0x14) = uVar10;
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::_M_move_assign
              ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
               ((long)begin + (0x20 - lVar24)),&end->row_ep);
    *(ulong *)((long)&end->row_ep_norm2 + 4) = CONCAT44(uStack_128,local_12c);
    *(undefined8 *)((long)&end->score + 4) = uVar30;
    end->fractionality = dVar18;
    end->row_ep_norm2 = dVar19;
    ppVar5 = (end->row_ep).
             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    (end->row_ep).
    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
    super__Vector_impl_data._M_start = ppVar20;
    (end->row_ep).
    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
    super__Vector_impl_data._M_finish = ppVar21;
    (end->row_ep).
    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = ppVar4;
    if (ppVar5 != (pointer)0x0) {
      operator_delete(ppVar5);
    }
    _Var35._M_current = (FractionalInteger *)((long)begin + (0x38 - lVar24));
    pFVar31 = end;
    pFVar36 = _Var35._M_current;
    local_1e8._M_current = end;
    if (_Var35._M_current < end) {
      local_1f8 = 0;
      lVar24 = 0;
      uVar38 = 0;
      uVar39 = 0;
      first._M_current = _Var35._M_current;
      do {
        uVar34 = 0;
        uVar25 = ((long)pFVar31 - (long)pFVar36 >> 3) * 0x6db6db6db6db6db7;
        uVar26 = uVar25 >> (uVar38 == 0);
        if (uVar39 != 0) {
          uVar26 = uVar34;
        }
        uVar25 = uVar25 - uVar26;
        if (uVar38 != 0) {
          uVar25 = uVar34;
        }
        if (uVar26 < 0x40) {
          if (uVar26 != 0) {
            uVar29 = 0;
            do {
              local_100[uVar39] = (char)uVar29;
              uVar29 = uVar29 + 1;
              uVar39 = uVar39 + (pFVar36->score <= dVar1);
              pFVar36 = pFVar36 + 1;
            } while (uVar26 != uVar29);
          }
        }
        else {
          uVar26 = 0xfffffffffffffff8;
          do {
            uVar29 = uVar26 + 8;
            local_100[uVar39] = (char)uVar29;
            lVar27 = (pFVar36->score <= dVar1) + uVar39;
            cVar6 = (char)uVar26;
            local_100[lVar27] = cVar6 + '\t';
            lVar27 = (ulong)(pFVar36[1].score <= dVar1) + lVar27;
            local_100[lVar27] = cVar6 + '\n';
            lVar27 = (ulong)(pFVar36[2].score <= dVar1) + lVar27;
            local_100[lVar27] = cVar6 + '\v';
            lVar27 = (ulong)(pFVar36[3].score <= dVar1) + lVar27;
            local_100[lVar27] = cVar6 + '\f';
            lVar27 = (ulong)(pFVar36[4].score <= dVar1) + lVar27;
            local_100[lVar27] = cVar6 + '\r';
            lVar27 = (ulong)(pFVar36[5].score <= dVar1) + lVar27;
            local_100[lVar27] = cVar6 + '\x0e';
            lVar27 = (ulong)(pFVar36[6].score <= dVar1) + lVar27;
            local_100[lVar27] = cVar6 + '\x0f';
            uVar39 = (ulong)(pFVar36[7].score <= dVar1) + lVar27;
            pFVar36 = pFVar36 + 8;
            uVar26 = uVar29;
          } while (uVar29 < 0x38);
        }
        if (uVar25 < 0x40) {
          if (uVar25 != 0) {
            uVar26 = 0;
            do {
              uVar26 = uVar26 + 1;
              local_80[uVar38] = (char)uVar26;
              pFVar23 = pFVar31 + -1;
              pFVar31 = pFVar31 + -1;
              uVar38 = uVar38 + (dVar1 < pFVar23->score);
            } while (uVar25 != uVar26);
          }
        }
        else {
          uVar26 = 0xfffffffffffffff8;
          do {
            cVar6 = (char)uVar26;
            local_80[uVar38] = cVar6 + '\t';
            lVar27 = (dVar1 < pFVar31[-1].score) + uVar38;
            local_80[lVar27] = cVar6 + '\n';
            lVar27 = (ulong)(dVar1 < pFVar31[-2].score) + lVar27;
            local_80[lVar27] = cVar6 + '\v';
            lVar27 = (ulong)(dVar1 < pFVar31[-3].score) + lVar27;
            local_80[lVar27] = cVar6 + '\f';
            lVar27 = (ulong)(dVar1 < pFVar31[-4].score) + lVar27;
            local_80[lVar27] = cVar6 + '\r';
            lVar27 = (ulong)(dVar1 < pFVar31[-5].score) + lVar27;
            local_80[lVar27] = cVar6 + '\x0e';
            lVar27 = (ulong)(dVar1 < pFVar31[-6].score) + lVar27;
            local_80[lVar27] = cVar6 + '\x0f';
            lVar27 = (ulong)(dVar1 < pFVar31[-7].score) + lVar27;
            local_80[lVar27] = cVar6 + '\x10';
            pFVar23 = pFVar31 + -8;
            pFVar31 = pFVar31 + -8;
            uVar38 = (ulong)(dVar1 < pFVar23->score) + lVar27;
            uVar26 = uVar26 + 8;
          } while (uVar26 < 0x38);
        }
        uVar26 = uVar39;
        if (uVar38 < uVar39) {
          uVar26 = uVar38;
        }
        offsets_l = local_100 + local_1f8;
        local_1f8 = local_1f8 + uVar26;
        _Var35._M_current = first._M_current;
        if (uVar39 <= uVar38) {
          local_1f8 = uVar34;
          _Var35._M_current = pFVar36;
        }
        swap_offsets<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>>
                  (first,local_1e8,offsets_l,local_80 + lVar24,uVar26,uVar39 == uVar38);
        uVar39 = uVar39 - uVar26;
        uVar38 = uVar38 - uVar26;
        lVar24 = lVar24 + uVar26;
        if (uVar38 == 0) {
          lVar24 = 0;
          local_1e8._M_current = pFVar31;
        }
        first._M_current = _Var35._M_current;
      } while (pFVar36 < pFVar31);
    }
    else {
      uVar39 = 0;
      uVar38 = 0;
      lVar24 = 0;
      local_1f8 = 0;
    }
    if (uVar39 != 0) {
      pvVar33 = &pFVar31[-1].row_ep;
      do {
        pvVar32 = pvVar33;
        pFVar36 = _Var35._M_current + (&bStack_101)[uVar39 + local_1f8];
        pvVar33 = &pFVar36->row_ep;
        dVar18 = pFVar36->fractionality;
        dVar19 = pFVar36->row_ep_norm2;
        uVar30 = *(undefined8 *)((long)&pFVar36->score + 4);
        uStack_198 = (undefined4)((ulong)*(undefined8 *)((long)&pFVar36->row_ep_norm2 + 4) >> 0x20);
        local_19c = (undefined4)((ulong)dVar19 >> 0x20);
        ppVar4 = (pFVar36->row_ep).
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        ppVar20 = (pvVar33->
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        ppVar21 = (pFVar36->row_ep).
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        (pvVar33->
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (pFVar36->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_finish = (pointer)0x0;
        (pFVar36->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        uVar7 = *(undefined4 *)((long)(pvVar32 + -2) + 0x14);
        uVar8 = *(undefined4 *)(pvVar32 + -1);
        uVar9 = *(undefined4 *)((long)(pvVar32 + -1) + 4);
        uVar10 = *(undefined4 *)((long)(pvVar32 + -1) + 4);
        uVar11 = *(undefined4 *)((long)(pvVar32 + -1) + 8);
        uVar12 = *(undefined4 *)((long)(pvVar32 + -1) + 0xc);
        HVar13 = *(HighsInt *)((long)(pvVar32 + -1) + 0x10);
        *(undefined4 *)&pFVar36->fractionality = *(undefined4 *)((long)(pvVar32 + -2) + 0x10);
        *(undefined4 *)((long)&pFVar36->fractionality + 4) = uVar7;
        *(undefined4 *)&pFVar36->row_ep_norm2 = uVar8;
        *(undefined4 *)((long)&pFVar36->row_ep_norm2 + 4) = uVar9;
        *(undefined4 *)((long)&pFVar36->row_ep_norm2 + 4) = uVar10;
        *(undefined4 *)&pFVar36->score = uVar11;
        *(undefined4 *)((long)&pFVar36->score + 4) = uVar12;
        pFVar36->basisIndex = HVar13;
        std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
        _M_move_assign(pvVar33,pvVar32);
        *(ulong *)((long)(pvVar32 + -1) + 4) = CONCAT44(uStack_198,local_19c);
        *(undefined8 *)((long)(pvVar32 + -1) + 0xc) = uVar30;
        *(double *)((long)(pvVar32 + -2) + 0x10) = dVar18;
        *(double *)(pvVar32 + -1) = dVar19;
        ppVar5 = (pvVar32->
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        (pvVar32->
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
        _M_impl.super__Vector_impl_data._M_start = ppVar20;
        (pvVar32->
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
        _M_impl.super__Vector_impl_data._M_finish = ppVar21;
        (pvVar32->
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage = ppVar4;
        if (ppVar5 != (pointer)0x0) {
          operator_delete(ppVar5);
        }
        uVar39 = uVar39 - 1;
        pvVar33 = (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                  ((long)(pvVar32 + -3) + 0x10);
      } while (uVar39 != 0);
      pFVar36 = (FractionalInteger *)((long)(pvVar32 + -2) + 0x10);
    }
    if (uVar38 != 0) {
      do {
        pFVar31 = pFVar36;
        pFVar36 = local_1e8._M_current + -(ulong)(&bStack_81)[uVar38 + lVar24];
        pvVar33 = &pFVar36->row_ep;
        dVar18 = pFVar36->fractionality;
        dVar19 = pFVar36->row_ep_norm2;
        uVar30 = *(undefined8 *)((long)&pFVar36->score + 4);
        uStack_198 = (undefined4)((ulong)*(undefined8 *)((long)&pFVar36->row_ep_norm2 + 4) >> 0x20);
        local_19c = (undefined4)((ulong)dVar19 >> 0x20);
        ppVar4 = (pFVar36->row_ep).
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        ppVar20 = (pvVar33->
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        ppVar21 = (pFVar36->row_ep).
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        (pvVar33->
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (pFVar36->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_finish = (pointer)0x0;
        (pFVar36->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        uVar7 = *(undefined4 *)((long)&pFVar31->fractionality + 4);
        uVar8 = *(undefined4 *)&pFVar31->row_ep_norm2;
        uVar9 = *(undefined4 *)((long)&pFVar31->row_ep_norm2 + 4);
        uVar10 = *(undefined4 *)((long)&pFVar31->row_ep_norm2 + 4);
        uVar11 = *(undefined4 *)&pFVar31->score;
        uVar12 = *(undefined4 *)((long)&pFVar31->score + 4);
        HVar13 = pFVar31->basisIndex;
        *(undefined4 *)&pFVar36->fractionality = *(undefined4 *)&pFVar31->fractionality;
        *(undefined4 *)((long)&pFVar36->fractionality + 4) = uVar7;
        *(undefined4 *)&pFVar36->row_ep_norm2 = uVar8;
        *(undefined4 *)((long)&pFVar36->row_ep_norm2 + 4) = uVar9;
        *(undefined4 *)((long)&pFVar36->row_ep_norm2 + 4) = uVar10;
        *(undefined4 *)&pFVar36->score = uVar11;
        *(undefined4 *)((long)&pFVar36->score + 4) = uVar12;
        pFVar36->basisIndex = HVar13;
        std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
        _M_move_assign(pvVar33,&pFVar31->row_ep);
        *(ulong *)((long)&pFVar31->row_ep_norm2 + 4) = CONCAT44(uStack_198,local_19c);
        *(undefined8 *)((long)&pFVar31->score + 4) = uVar30;
        pFVar31->fractionality = dVar18;
        pFVar31->row_ep_norm2 = dVar19;
        ppVar5 = (pFVar31->row_ep).
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        (pFVar31->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_start = ppVar20;
        (pFVar31->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_finish = ppVar21;
        (pFVar31->row_ep).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage = ppVar4;
        if (ppVar5 != (pointer)0x0) {
          operator_delete(ppVar5);
        }
        uVar38 = uVar38 - 1;
        pFVar36 = pFVar31 + 1;
      } while (uVar38 != 0);
      pFVar36 = pFVar31 + 1;
    }
  }
  uVar7 = *(undefined4 *)&pFVar36[-1].fractionality;
  uVar8 = *(undefined4 *)((long)&pFVar36[-1].fractionality + 4);
  uVar9 = *(undefined4 *)&pFVar36[-1].row_ep_norm2;
  uVar10 = *(undefined4 *)((long)&pFVar36[-1].row_ep_norm2 + 4);
  uVar11 = *(undefined4 *)&pFVar36[-1].score;
  uVar12 = *(undefined4 *)((long)&pFVar36[-1].score + 4);
  HVar13 = pFVar36[-1].basisIndex;
  *(undefined4 *)((long)begin + 0xc) = *(undefined4 *)((long)&pFVar36[-1].row_ep_norm2 + 4);
  *(undefined4 *)(begin + 2) = uVar11;
  *(undefined4 *)((long)begin + 0x14) = uVar12;
  *(HighsInt *)(begin + 3) = HVar13;
  *(undefined4 *)begin = uVar7;
  *(undefined4 *)((long)begin + 4) = uVar8;
  *(undefined4 *)(begin + 1) = uVar9;
  *(undefined4 *)((long)begin + 0xc) = uVar10;
  std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::_M_move_assign
            ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)(begin + 4)
             ,&pFVar36[-1].row_ep);
  pFVar36[-1].fractionality = dVar14;
  pFVar36[-1].row_ep_norm2 = dVar15;
  pFVar36[-1].score = dVar1;
  pFVar36[-1].basisIndex = HVar2;
  ppVar4 = pFVar36[-1].row_ep.
           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pFVar36[-1].row_ep.
  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
  super__Vector_impl_data._M_start = ppVar16;
  pFVar36[-1].row_ep.
  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = ppVar17;
  pFVar36[-1].row_ep.
  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = ppVar3;
  uVar30 = extraout_RDX;
  if (ppVar4 != (pointer)0x0) {
    operator_delete(ppVar4);
    uVar30 = extraout_RDX_00;
  }
  pVar40._9_7_ = (undefined7)((ulong)uVar30 >> 8);
  pVar40.second = end <= pFVar37;
  pVar40.first._M_current = pFVar36 + -1;
  return pVar40;
}

Assistant:

inline std::pair<Iter, bool> partition_right_branchless(Iter begin, Iter end, Compare comp) {
        typedef typename std::iterator_traits<Iter>::value_type T;

        // Move pivot into local for speed.
        T pivot(PDQSORT_PREFER_MOVE(*begin));
        Iter first = begin;
        Iter last = end;

        // Find the first element greater than or equal than the pivot (the median of 3 guarantees
        // this exists).
        while (comp(*++first, pivot));

        // Find the first element strictly smaller than the pivot. We have to guard this search if
        // there was no element before *first.
        if (first - 1 == begin) while (first < last && !comp(*--last, pivot));
        else                    while (                !comp(*--last, pivot));

        // If the first pair of elements that should be swapped to partition are the same element,
        // the passed in sequence already was correctly partitioned.
        bool already_partitioned = first >= last;
        if (!already_partitioned) {
            std::iter_swap(first, last);
            ++first;

            // The following branchless partitioning is derived from "BlockQuicksort: How Branch
            // Mispredictions don’t affect Quicksort" by Stefan Edelkamp and Armin Weiss, but
            // heavily micro-optimized.
            unsigned char offsets_l_storage[block_size + cacheline_size];
            unsigned char offsets_r_storage[block_size + cacheline_size];
            unsigned char* offsets_l = align_cacheline(offsets_l_storage);
            unsigned char* offsets_r = align_cacheline(offsets_r_storage);

            Iter offsets_l_base = first;
            Iter offsets_r_base = last;
            size_t num_l, num_r, start_l, start_r;
            num_l = num_r = start_l = start_r = 0;
            
            while (first < last) {
                // Fill up offset blocks with elements that are on the wrong side.
                // First we determine how much elements are considered for each offset block.
                size_t num_unknown = last - first;
                size_t left_split = num_l == 0 ? (num_r == 0 ? num_unknown / 2 : num_unknown) : 0;
                size_t right_split = num_r == 0 ? (num_unknown - left_split) : 0;

                // Fill the offset blocks.
                if (left_split >= block_size) {
                    for (size_t i = 0; i < block_size;) {
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                    }
                } else {
                    for (size_t i = 0; i < left_split;) {
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                    }
                }

                if (right_split >= block_size) {
                    for (size_t i = 0; i < block_size;) {
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                    }
                } else {
                    for (size_t i = 0; i < right_split;) {
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                    }
                }

                // Swap elements and update block sizes and first/last boundaries.
                size_t num = std::min(num_l, num_r);
                swap_offsets(offsets_l_base, offsets_r_base,
                             offsets_l + start_l, offsets_r + start_r,
                             num, num_l == num_r);
                num_l -= num; num_r -= num;
                start_l += num; start_r += num;

                if (num_l == 0) {
                    start_l = 0;
                    offsets_l_base = first;
                }
                
                if (num_r == 0) {
                    start_r = 0;
                    offsets_r_base = last;
                }
            }

            // We have now fully identified [first, last)'s proper position. Swap the last elements.
            if (num_l) {
                offsets_l += start_l;
                while (num_l--) std::iter_swap(offsets_l_base + offsets_l[num_l], --last);
                first = last;
            }
            if (num_r) {
                offsets_r += start_r;
                while (num_r--) std::iter_swap(offsets_r_base - offsets_r[num_r], first), ++first;
                last = first;
            }
        }

        // Put the pivot in the right place.
        Iter pivot_pos = first - 1;
        *begin = PDQSORT_PREFER_MOVE(*pivot_pos);
        *pivot_pos = PDQSORT_PREFER_MOVE(pivot);

        return std::make_pair(pivot_pos, already_partitioned);
    }